

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O3

BOOL __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
ProtectAllocationWithExecuteReadWrite
          (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          Allocation *allocation,char *addressInPage)

{
  BOOL BVar1;
  
  BVar1 = ProtectAllocation(this,allocation,0x40,0x20,addressInPage);
  return BVar1;
}

Assistant:

BOOL Heap<TAlloc, TPreReservedAlloc>::ProtectAllocationWithExecuteReadWrite(Allocation *allocation, __in_opt char* addressInPage)
{
    DWORD protectFlags = 0;

    if (GlobalSecurityPolicy::IsCFGEnabled())
    {
        protectFlags = PAGE_EXECUTE_RW_TARGETS_NO_UPDATE;
    }
    else
    {
        #if defined(__APPLE__) && defined(_M_ARM64)
        protectFlags = PAGE_READWRITE; // PAGE_EXECUTE_READWRITE banned on Apple Silicon
        #else
        protectFlags = PAGE_EXECUTE_READWRITE;
        #endif
    }
    return this->ProtectAllocation(allocation, protectFlags, PAGE_EXECUTE_READ, addressInPage);
}